

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeMergeEngineStep(MergeEngine *pMerger,int *pbEof)

{
  SortSubtask *pSVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  PmaReader *pPVar7;
  PmaReader *pPVar8;
  int bCached;
  int local_3c;
  uint *local_38;
  
  pSVar1 = pMerger->pTask;
  uVar6 = pMerger->aTree[1];
  uVar4 = vdbePmaReaderNext(pMerger->aReadr + (int)uVar6);
  if (uVar4 == 0) {
    local_3c = 0;
    uVar4 = pMerger->nTree + uVar6;
    local_38 = (uint *)pbEof;
    if (1 < (int)uVar4) {
      pPVar8 = pMerger->aReadr + ((long)(int)uVar6 | 1);
      pPVar7 = (PmaReader *)((long)&pMerger->aReadr->iReadOff + (ulong)((uVar6 & 0xfffe) * 0x50));
      do {
        if (pPVar7->pFd == (sqlite3_file *)0x0) {
          iVar5 = 1;
        }
        else if (pPVar8->pFd == (sqlite3_file *)0x0) {
          iVar5 = -1;
        }
        else {
          iVar5 = (*pSVar1->xCompare)(pSVar1,&local_3c,pPVar7->aKey,pPVar7->nKey,pPVar8->aKey,
                                      pPVar8->nKey);
        }
        uVar6 = uVar4 >> 1;
        if ((iVar5 < 0) || ((iVar5 == 0 && (pPVar7 < pPVar8)))) {
          piVar2 = pMerger->aTree;
          pPVar8 = pMerger->aReadr;
          piVar2[uVar6] = (int)((ulong)((long)pPVar7 - (long)pPVar8) >> 4) * -0x33333333;
          pPVar8 = pPVar8 + piVar2[uVar6 ^ 1];
          local_3c = 0;
        }
        else {
          if (pPVar7->pFd != (sqlite3_file *)0x0) {
            local_3c = 0;
          }
          piVar2 = pMerger->aTree;
          pPVar7 = pMerger->aReadr;
          piVar2[uVar6] = (int)((ulong)((long)pPVar8 - (long)pPVar7) >> 4) * -0x33333333;
          pPVar7 = pPVar7 + piVar2[uVar6 ^ 1];
        }
        bVar3 = 3 < uVar4;
        uVar4 = uVar6;
      } while (bVar3);
    }
    *local_38 = (uint)(pMerger->aReadr[pMerger->aTree[1]].pFd == (sqlite3_file *)0x0);
    uVar4 = (uint)pSVar1->pUnpacked->errCode;
  }
  return uVar4;
}

Assistant:

static int vdbeMergeEngineStep(
  MergeEngine *pMerger,      /* The merge engine to advance to the next row */
  int *pbEof                 /* Set TRUE at EOF.  Set false for more content */
){
  int rc;
  int iPrev = pMerger->aTree[1];/* Index of PmaReader to advance */
  SortSubtask *pTask = pMerger->pTask;

  /* Advance the current PmaReader */
  rc = vdbePmaReaderNext(&pMerger->aReadr[iPrev]);

  /* Update contents of aTree[] */
  if( rc==SQLITE_OK ){
    int i;                      /* Index of aTree[] to recalculate */
    PmaReader *pReadr1;         /* First PmaReader to compare */
    PmaReader *pReadr2;         /* Second PmaReader to compare */
    int bCached = 0;

    /* Find the first two PmaReaders to compare. The one that was just
    ** advanced (iPrev) and the one next to it in the array.  */
    pReadr1 = &pMerger->aReadr[(iPrev & 0xFFFE)];
    pReadr2 = &pMerger->aReadr[(iPrev | 0x0001)];

    for(i=(pMerger->nTree+iPrev)/2; i>0; i=i/2){
      /* Compare pReadr1 and pReadr2. Store the result in variable iRes. */
      int iRes;
      if( pReadr1->pFd==0 ){
        iRes = +1;
      }else if( pReadr2->pFd==0 ){
        iRes = -1;
      }else{
        iRes = pTask->xCompare(pTask, &bCached,
            pReadr1->aKey, pReadr1->nKey, pReadr2->aKey, pReadr2->nKey
        );
      }

      /* If pReadr1 contained the smaller value, set aTree[i] to its index.
      ** Then set pReadr2 to the next PmaReader to compare to pReadr1. In this
      ** case there is no cache of pReadr2 in pTask->pUnpacked, so set
      ** pKey2 to point to the record belonging to pReadr2.
      **
      ** Alternatively, if pReadr2 contains the smaller of the two values,
      ** set aTree[i] to its index and update pReadr1. If vdbeSorterCompare()
      ** was actually called above, then pTask->pUnpacked now contains
      ** a value equivalent to pReadr2. So set pKey2 to NULL to prevent
      ** vdbeSorterCompare() from decoding pReadr2 again.
      **
      ** If the two values were equal, then the value from the oldest
      ** PMA should be considered smaller. The VdbeSorter.aReadr[] array
      ** is sorted from oldest to newest, so pReadr1 contains older values
      ** than pReadr2 iff (pReadr1<pReadr2).  */
      if( iRes<0 || (iRes==0 && pReadr1<pReadr2) ){
        pMerger->aTree[i] = (int)(pReadr1 - pMerger->aReadr);
        pReadr2 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
        bCached = 0;
      }else{
        if( pReadr1->pFd ) bCached = 0;
        pMerger->aTree[i] = (int)(pReadr2 - pMerger->aReadr);
        pReadr1 = &pMerger->aReadr[ pMerger->aTree[i ^ 0x0001] ];
      }
    }
    *pbEof = (pMerger->aReadr[pMerger->aTree[1]].pFd==0);
  }

  return (rc==SQLITE_OK ? pTask->pUnpacked->errCode : rc);
}